

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spl_inl.h
# Opt level: O0

int16_t WebRtcSpl_NormU32(uint32_t a)

{
  undefined2 local_12;
  int16_t zeros;
  uint32_t a_local;
  
  if (a == 0) {
    zeros = 0;
  }
  else {
    if ((a & 0xffff0000) == 0) {
      local_12 = 0x10;
    }
    else {
      local_12 = 0;
    }
    if ((a << (sbyte)local_12 & 0xff000000) == 0) {
      local_12 = local_12 + 8;
    }
    if ((a << ((byte)local_12 & 0x1f) & 0xf0000000) == 0) {
      local_12 = local_12 + 4;
    }
    if ((a << ((byte)local_12 & 0x1f) & 0xc0000000) == 0) {
      local_12 = local_12 + 2;
    }
    if ((a << ((byte)local_12 & 0x1f) & 0x80000000) == 0) {
      local_12 = local_12 + 1;
    }
    zeros = local_12;
  }
  return zeros;
}

Assistant:

static __inline int16_t WebRtcSpl_NormU32(uint32_t a) {
  int16_t zeros;

  if (a == 0) return 0;

  if (!(0xFFFF0000 & a)) {
    zeros = 16;
  } else {
    zeros = 0;
  }
  if (!(0xFF000000 & (a << zeros))) zeros += 8;
  if (!(0xF0000000 & (a << zeros))) zeros += 4;
  if (!(0xC0000000 & (a << zeros))) zeros += 2;
  if (!(0x80000000 & (a << zeros))) zeros += 1;

  return zeros;
}